

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O3

parser_error parse_constants_level_max(parser *p)

{
  wchar_t wVar1;
  int iVar2;
  parser_error pVar3;
  void *pvVar4;
  char *__s1;
  
  pvVar4 = parser_priv(p);
  __s1 = parser_getsym(p,"label");
  wVar1 = parser_getint(p,"value");
  if (wVar1 < L'\0') {
    pVar3 = PARSE_ERROR_INVALID_VALUE;
  }
  else {
    iVar2 = strcmp(__s1,"monsters");
    pVar3 = PARSE_ERROR_UNDEFINED_DIRECTIVE;
    if (iVar2 == 0) {
      *(short *)((long)pvVar4 + 0x2e) = (short)wVar1;
      pVar3 = PARSE_ERROR_NONE;
    }
  }
  return pVar3;
}

Assistant:

static enum parser_error parse_constants_level_max(struct parser *p) {
	struct angband_constants *z;
	const char *label;
	int value;

	z = parser_priv(p);
	label = parser_getsym(p, "label");
	value = parser_getint(p, "value");

	if (value < 0)
		return PARSE_ERROR_INVALID_VALUE;

	if (streq(label, "monsters"))
		z->level_monster_max = value;
	else
		return PARSE_ERROR_UNDEFINED_DIRECTIVE;

	return PARSE_ERROR_NONE;
}